

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

char * start_capture(MatchState *ms,char *s,char *p,int what)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  int level;
  char *res;
  int what_local;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  bVar1 = ms->level;
  uVar2 = (uint)bVar1;
  if (0x1f < uVar2) {
    luaL_error(ms->L,"too many captures");
  }
  ms->capture[(int)uVar2].init = s;
  ms->capture[(int)uVar2].len = (long)what;
  ms->level = bVar1 + 1;
  pcVar3 = match(ms,s,p);
  if (pcVar3 == (char *)0x0) {
    ms->level = ms->level + 0xff;
  }
  return pcVar3;
}

Assistant:

static const char *start_capture (MatchState *ms, const char *s,
                                    const char *p, int what) {
  const char *res;
  int level = ms->level;
  if (level >= LUA_MAXCAPTURES) luaL_error(ms->L, "too many captures");
  ms->capture[level].init = s;
  ms->capture[level].len = what;
  ms->level = level+1;
  if ((res=match(ms, s, p)) == NULL)  /* match failed? */
    ms->level--;  /* undo capture */
  return res;
}